

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O3

Color __thiscall
ConductorBRDF::sample_f
          (ConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Color CVar23;
  
  fVar7 = wo->z;
  uVar3._0_4_ = wo->x;
  uVar3._4_4_ = wo->y;
  wi->x = (float)(int)(uVar3 ^ 0x8000000080000000);
  wi->y = (float)(int)((uVar3 ^ 0x8000000080000000) >> 0x20);
  wi->z = fVar7;
  fVar7 = wo->z;
  fVar8 = ABS(fVar7);
  *pdf = 1.0;
  fVar9 = *(float *)&this->field_0x18;
  fVar11 = (this->k).z;
  fVar17 = fVar11 * fVar11 + fVar9 * fVar9;
  fVar7 = fVar7 * fVar7;
  fVar11 = (fVar9 + fVar9) * fVar8;
  auVar16._4_4_ = (fVar17 - fVar11) + fVar7;
  auVar16._0_4_ = 0x3f000000;
  auVar16._8_8_ = 0;
  auVar10._4_4_ = fVar11 + fVar17 + fVar7;
  auVar10._0_4_ = fVar8;
  auVar10._8_8_ = 0;
  auVar10 = divps(auVar16,auVar10);
  fVar9 = auVar10._0_4_;
  uVar4 = *(undefined8 *)&(this->super_BRDF).field_0x10;
  fVar18 = (float)uVar4;
  fVar19 = (float)((ulong)uVar4 >> 0x20);
  uVar1 = (this->k).x;
  uVar5 = (this->k).y;
  fVar21 = (float)uVar1 * (float)uVar1 + fVar18 * fVar18;
  fVar22 = (float)uVar5 * (float)uVar5 + fVar19 * fVar19;
  fVar18 = fVar8 * (fVar18 + fVar18);
  fVar19 = fVar8 * (fVar19 + fVar19);
  fVar20 = fVar8 * 0.0;
  fVar8 = fVar8 * 0.0;
  auVar15._0_4_ = (fVar7 * fVar21 - fVar18) + 1.0;
  auVar15._4_4_ = (fVar7 * fVar22 - fVar19) + 1.0;
  auVar15._8_4_ = (fVar7 * 0.0 - fVar20) + 0.0;
  auVar15._12_4_ = (fVar7 * 0.0 - fVar8) + 0.0;
  auVar12._0_4_ = fVar18 + fVar7 * fVar21 + 1.0;
  auVar12._4_4_ = fVar19 + fVar7 * fVar22 + 1.0;
  auVar12._8_4_ = fVar20 + fVar7 * 0.0 + 0.0;
  auVar12._12_4_ = fVar8 + fVar7 * 0.0 + 0.0;
  auVar16 = divps(auVar15,auVar12);
  auVar13._0_4_ = (fVar21 - fVar18) + fVar7;
  auVar13._4_4_ = (fVar22 - fVar19) + fVar7;
  auVar13._8_4_ = (0.0 - fVar20) + fVar7;
  auVar13._12_4_ = (0.0 - fVar8) + fVar7;
  auVar14._4_4_ = fVar19 + fVar22 + fVar7;
  auVar14._0_4_ = fVar18 + fVar21 + fVar7;
  auVar14._8_4_ = fVar20 + 0.0 + fVar7;
  auVar14._12_4_ = fVar8 + 0.0 + fVar7;
  auVar14 = divps(auVar13,auVar14);
  uVar2 = albedo->x;
  uVar6 = albedo->y;
  CVar23.x = (float)uVar2 * fVar9 * (auVar14._0_4_ + auVar16._0_4_);
  CVar23.y = (float)uVar6 * fVar9 * (auVar14._4_4_ + auVar16._4_4_);
  CVar23.z = (auVar10._4_4_ + ((fVar7 * fVar17 - fVar11) + 1.0) / (fVar11 + fVar7 * fVar17 + 1.0)) *
             fVar9 * albedo->z;
  return CVar23;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		wi = vec3f(-wo.x, -wo.y, wo.z);
		float cos = fabs(wo.z);
		pdf = 1;
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		return 0.5 / cos * (r1 + r2) * albedo;
	}